

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gregorian.cpp
# Opt level: O2

string * __thiscall
booster::locale::util::gregorian_calendar::get_timezone_abi_cxx11_
          (string *__return_storage_ptr__,gregorian_calendar *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->time_zone_name_);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string get_timezone() const
            {
                return time_zone_name_;
            }